

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cpp
# Opt level: O3

uint32_t getSectIDIfAny(Section *sect)

{
  uint32_t uVar1;
  Section *pSVar2;
  
  if (sect == (Section *)0x0) {
    return 0xffffffff;
  }
  if (sectionList != (Section *)0x0) {
    uVar1 = 0;
    pSVar2 = sectionList;
    do {
      if (pSVar2 == sect) {
        return uVar1;
      }
      uVar1 = uVar1 + 1;
      pSVar2 = pSVar2->next;
    } while (pSVar2 != (Section *)0x0);
  }
  fatalerror("Unknown section \'%s\'\n",sect->name);
}

Assistant:

static uint32_t getSectIDIfAny(struct Section const *sect)
{
	return sect ? getsectid(sect) : (uint32_t)-1;
}